

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall LowererMD::GenerateFastInlineBuiltInMathPow(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  StackSym *pSVar4;
  RegOpnd *dst;
  undefined4 *puVar5;
  RegOpnd *boolRefOpnd;
  SymOpnd *boolOpnd;
  Opnd *bailoutOpnd;
  JnHelperMethod directPowHelper;
  Instr *instr_local;
  LowererMD *this_local;
  
  boolOpnd = (SymOpnd *)0x0;
  pOVar3 = IR::Instr::GetSrc2(instr);
  bVar2 = IR::Opnd::IsFloat(pOVar3);
  if (bVar2) {
    pOVar3 = IR::Instr::GetSrc1(instr);
    bVar2 = IR::Opnd::IsFloat(pOVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x21b0,"(instr->GetSrc1()->IsFloat())",
                         "Math.Pow(int, double) should not generated by GlobOpt!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bailoutOpnd._4_4_ = HelperDirectMath_Pow;
    pOVar3 = IR::Instr::UnlinkSrc2(instr);
    LoadDoubleHelperArgument(this,instr,pOVar3);
    pOVar3 = IR::Instr::UnlinkSrc1(instr);
    LoadDoubleHelperArgument(this,instr,pOVar3);
  }
  else {
    pOVar3 = IR::Instr::UnlinkSrc2(instr);
    LoadHelperArgument(this,instr,pOVar3);
    pOVar3 = IR::Instr::GetSrc1(instr);
    bVar2 = IR::Opnd::IsFloat(pOVar3);
    if (bVar2) {
      bailoutOpnd._4_4_ = HelperDirectMath_PowDoubleInt;
      pOVar3 = IR::Instr::UnlinkSrc1(instr);
      LoadDoubleHelperArgument(this,instr,pOVar3);
    }
    else {
      bailoutOpnd._4_4_ = HelperDirectMath_PowIntInt;
      pOVar3 = IR::Instr::UnlinkSrc1(instr);
      LoadHelperArgument(this,instr,pOVar3);
      if (this->m_func->tempSymBool == (StackSym *)0x0) {
        pSVar4 = StackSym::New(TyUint8,this->m_func);
        this->m_func->tempSymBool = pSVar4;
        Func::StackAllocate(this->m_func,this->m_func->tempSymBool,1);
      }
      boolOpnd = IR::SymOpnd::New(&this->m_func->tempSymBool->super_Sym,TyUint8,this->m_func);
      dst = IR::RegOpnd::New(TyInt64,this->m_func);
      Lowerer::InsertLea(dst,&boolOpnd->super_Opnd,instr);
      LoadHelperArgument(this,instr,&dst->super_Opnd);
    }
  }
  ChangeToHelperCall(this,instr,bailoutOpnd._4_4_,(LabelInstr *)0x0,&boolOpnd->super_Opnd,
                     (PropertySymOpnd *)0x0,false);
  return;
}

Assistant:

void LowererMD::GenerateFastInlineBuiltInMathPow(IR::Instr* instr)
{
#ifdef _M_IX86
    AssertMsg(!instr->GetSrc2()->IsFloat(), "Math.pow(*, double) needs customized lowering!");
#endif

    IR::JnHelperMethod directPowHelper = (IR::JnHelperMethod)0;
    IR::Opnd* bailoutOpnd = nullptr;

    if (!instr->GetSrc2()->IsFloat())
    {
        LoadHelperArgument(instr, instr->UnlinkSrc2());

        if (instr->GetSrc1()->IsFloat())
        {
            directPowHelper = IR::HelperDirectMath_PowDoubleInt;
            LoadDoubleHelperArgument(instr, instr->UnlinkSrc1());
        }
        else
        {
            directPowHelper = IR::HelperDirectMath_PowIntInt;
            LoadHelperArgument(instr, instr->UnlinkSrc1());

            if (!this->m_func->tempSymBool)
            {
                this->m_func->tempSymBool = StackSym::New(TyUint8, this->m_func);
                this->m_func->StackAllocate(this->m_func->tempSymBool, TySize[TyUint8]);
            }
            IR::SymOpnd* boolOpnd = IR::SymOpnd::New(this->m_func->tempSymBool, TyUint8, this->m_func);
            IR::RegOpnd* boolRefOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
            this->m_lowerer->InsertLea(boolRefOpnd, boolOpnd, instr);
            LoadHelperArgument(instr, boolRefOpnd);

            bailoutOpnd = boolOpnd;
        }
    }
#ifndef _M_IX86
    else
    {
        AssertMsg(instr->GetSrc1()->IsFloat(), "Math.Pow(int, double) should not generated by GlobOpt!");
        directPowHelper = IR::HelperDirectMath_Pow;
        LoadDoubleHelperArgument(instr, instr->UnlinkSrc2());
        LoadDoubleHelperArgument(instr, instr->UnlinkSrc1());
    }
#endif

    ChangeToHelperCall(instr, directPowHelper, nullptr, bailoutOpnd);
}